

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMClassifier.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::GLMClassifier::InternalSwap(GLMClassifier *this,GLMClassifier *other)

{
  int iVar1;
  uint32 uVar2;
  ClassLabelsUnion CVar3;
  
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->weights_).super_RepeatedPtrFieldBase,
             &(other->weights_).super_RepeatedPtrFieldBase);
  google::protobuf::RepeatedField<double>::InternalSwap(&this->offset_,&other->offset_);
  iVar1 = this->postevaluationtransform_;
  this->postevaluationtransform_ = other->postevaluationtransform_;
  other->postevaluationtransform_ = iVar1;
  iVar1 = this->classencoding_;
  this->classencoding_ = other->classencoding_;
  other->classencoding_ = iVar1;
  CVar3 = this->ClassLabels_;
  this->ClassLabels_ = other->ClassLabels_;
  other->ClassLabels_ = CVar3;
  uVar2 = this->_oneof_case_[0];
  this->_oneof_case_[0] = other->_oneof_case_[0];
  other->_oneof_case_[0] = uVar2;
  iVar1 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar1;
  return;
}

Assistant:

void GLMClassifier::InternalSwap(GLMClassifier* other) {
  weights_.InternalSwap(&other->weights_);
  offset_.InternalSwap(&other->offset_);
  std::swap(postevaluationtransform_, other->postevaluationtransform_);
  std::swap(classencoding_, other->classencoding_);
  std::swap(ClassLabels_, other->ClassLabels_);
  std::swap(_oneof_case_[0], other->_oneof_case_[0]);
  std::swap(_cached_size_, other->_cached_size_);
}